

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cert_errors.cc
# Opt level: O0

string * __thiscall
bssl::CertPathErrors::ToDebugString_abi_cxx11_
          (string *__return_storage_ptr__,CertPathErrors *this,ParsedCertificateList *certs)

{
  bool bVar1;
  CertErrors *pCVar2;
  ulong uVar3;
  __shared_ptr *this_00;
  __shared_ptr_access<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  *this_01;
  element_type *this_02;
  ParsedTbsCertificate *pPVar4;
  ostream *poVar5;
  undefined1 local_288 [8];
  string other_errors;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  uchar *local_228;
  size_t sStack_220;
  undefined1 local_210 [8];
  RDNSequence subject;
  string cert_name_debug_str;
  undefined1 local_1c8 [8];
  string cert_errors_string;
  CertErrors *errors;
  size_t i;
  ostringstream result;
  ParsedCertificateList *certs_local;
  CertPathErrors *this_local;
  
  ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&i);
  for (errors = (CertErrors *)0x0;
      pCVar2 = (CertErrors *)
               ::std::vector<bssl::CertErrors,_std::allocator<bssl::CertErrors>_>::size
                         (&this->cert_errors_), errors < pCVar2;
      errors = (CertErrors *)
               ((long)&(errors->nodes_).
                       super__Vector_base<bssl::CertError,_std::allocator<bssl::CertError>_>._M_impl
                       .super__Vector_impl_data._M_start + 1)) {
    cert_errors_string.field_2._8_8_ =
         ::std::vector<bssl::CertErrors,_std::allocator<bssl::CertErrors>_>::operator[]
                   (&this->cert_errors_,(size_type)errors);
    CertErrors::ToDebugString_abi_cxx11_
              ((string *)local_1c8,(CertErrors *)cert_errors_string.field_2._8_8_);
    uVar3 = ::std::__cxx11::string::empty();
    if ((uVar3 & 1) == 0) {
      ::std::__cxx11::string::string
                ((string *)
                 &subject.
                  super__Vector_base<std::vector<bssl::X509NameAttribute,_std::allocator<bssl::X509NameAttribute>_>,_std::allocator<std::vector<bssl::X509NameAttribute,_std::allocator<bssl::X509NameAttribute>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      pCVar2 = (CertErrors *)
               ::std::
               vector<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
               ::size(certs);
      if (errors < pCVar2) {
        this_00 = (__shared_ptr *)
                  ::std::
                  vector<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
                  ::operator[](certs,(size_type)errors);
        bVar1 = ::std::__shared_ptr::operator_cast_to_bool(this_00);
        if (bVar1) {
          ::std::
          vector<std::vector<bssl::X509NameAttribute,_std::allocator<bssl::X509NameAttribute>_>,_std::allocator<std::vector<bssl::X509NameAttribute,_std::allocator<bssl::X509NameAttribute>_>_>_>
          ::vector((vector<std::vector<bssl::X509NameAttribute,_std::allocator<bssl::X509NameAttribute>_>,_std::allocator<std::vector<bssl::X509NameAttribute,_std::allocator<bssl::X509NameAttribute>_>_>_>
                    *)local_210);
          this_01 = (__shared_ptr_access<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     *)::std::
                       vector<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
                       ::operator[](certs,(size_type)errors);
          this_02 = ::std::
                    __shared_ptr_access<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->(this_01);
          pPVar4 = ParsedCertificate::tbs(this_02);
          local_228 = (pPVar4->subject_tlv).data_.data_;
          sStack_220 = (pPVar4->subject_tlv).data_.size_;
          bVar1 = ParseName((Input)(pPVar4->subject_tlv).data_,(RDNSequence *)local_210);
          if ((bVar1) &&
             (bVar1 = ConvertToRFC2253((RDNSequence *)local_210,
                                       (string *)
                                       &subject.
                                        super__Vector_base<std::vector<bssl::X509NameAttribute,_std::allocator<bssl::X509NameAttribute>_>,_std::allocator<std::vector<bssl::X509NameAttribute,_std::allocator<bssl::X509NameAttribute>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage), bVar1))
          {
            ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             ((long)&other_errors.field_2 + 8)," (",
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &subject.
                              super__Vector_base<std::vector<bssl::X509NameAttribute,_std::allocator<bssl::X509NameAttribute>_>,_std::allocator<std::vector<bssl::X509NameAttribute,_std::allocator<bssl::X509NameAttribute>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
            ::std::operator+(&local_248,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             ((long)&other_errors.field_2 + 8),")");
            ::std::__cxx11::string::operator=
                      ((string *)
                       &subject.
                        super__Vector_base<std::vector<bssl::X509NameAttribute,_std::allocator<bssl::X509NameAttribute>_>,_std::allocator<std::vector<bssl::X509NameAttribute,_std::allocator<bssl::X509NameAttribute>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,(string *)&local_248);
            ::std::__cxx11::string::~string((string *)&local_248);
            ::std::__cxx11::string::~string((string *)(other_errors.field_2._M_local_buf + 8));
          }
          ::std::
          vector<std::vector<bssl::X509NameAttribute,_std::allocator<bssl::X509NameAttribute>_>,_std::allocator<std::vector<bssl::X509NameAttribute,_std::allocator<bssl::X509NameAttribute>_>_>_>
          ::~vector((vector<std::vector<bssl::X509NameAttribute,_std::allocator<bssl::X509NameAttribute>_>,_std::allocator<std::vector<bssl::X509NameAttribute,_std::allocator<bssl::X509NameAttribute>_>_>_>
                     *)local_210);
        }
      }
      poVar5 = ::std::operator<<((ostream *)&i,"----- Certificate i=");
      poVar5 = (ostream *)::std::ostream::operator<<(poVar5,(ulong)errors);
      poVar5 = ::std::operator<<(poVar5,(string *)
                                        &subject.
                                         super__Vector_base<std::vector<bssl::X509NameAttribute,_std::allocator<bssl::X509NameAttribute>_>,_std::allocator<std::vector<bssl::X509NameAttribute,_std::allocator<bssl::X509NameAttribute>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
      ::std::operator<<(poVar5," -----\n");
      poVar5 = ::std::operator<<((ostream *)&i,(string *)local_1c8);
      ::std::operator<<(poVar5,"\n");
      ::std::__cxx11::string::~string
                ((string *)
                 &subject.
                  super__Vector_base<std::vector<bssl::X509NameAttribute,_std::allocator<bssl::X509NameAttribute>_>,_std::allocator<std::vector<bssl::X509NameAttribute,_std::allocator<bssl::X509NameAttribute>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
    }
    ::std::__cxx11::string::~string((string *)local_1c8);
  }
  CertErrors::ToDebugString_abi_cxx11_((string *)local_288,&this->other_errors_);
  uVar3 = ::std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    ::std::operator<<((ostream *)&i,"----- Other errors (not certificate specific) -----\n");
    poVar5 = ::std::operator<<((ostream *)&i,(string *)local_288);
    ::std::operator<<(poVar5,"\n");
  }
  ::std::__cxx11::ostringstream::str();
  ::std::__cxx11::string::~string((string *)local_288);
  ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&i);
  return __return_storage_ptr__;
}

Assistant:

std::string CertPathErrors::ToDebugString(
    const ParsedCertificateList &certs) const {
  std::ostringstream result;

  for (size_t i = 0; i < cert_errors_.size(); ++i) {
    // Pretty print the current CertErrors. If there were no errors/warnings,
    // then continue.
    const CertErrors &errors = cert_errors_[i];
    std::string cert_errors_string = errors.ToDebugString();
    if (cert_errors_string.empty()) {
      continue;
    }

    // Add a header that identifies which certificate this CertErrors pertains
    // to.
    std::string cert_name_debug_str;
    if (i < certs.size() && certs[i]) {
      RDNSequence subject;
      if (ParseName(certs[i]->tbs().subject_tlv, &subject) &&
          ConvertToRFC2253(subject, &cert_name_debug_str)) {
        cert_name_debug_str = " (" + cert_name_debug_str + ")";
      }
    }
    result << "----- Certificate i=" << i << cert_name_debug_str << " -----\n";
    result << cert_errors_string << "\n";
  }

  // Print any other errors that aren't associated with a particular certificate
  // in the chain.
  std::string other_errors = other_errors_.ToDebugString();
  if (!other_errors.empty()) {
    result << "----- Other errors (not certificate specific) -----\n";
    result << other_errors << "\n";
  }

  return result.str();
}